

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O1

void add_linear_comb_weighted<float,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
               (size_t *ix_arr,size_t st,size_t end,double *res,float *x,double *coef,double x_sd,
               double x_mean,double *fill_val,MissingAction missing_action,double *buffer_arr,
               size_t *buffer_NAs,bool first_run,
               robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *w)

{
  double dVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  pointer __first;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  double *pdVar7;
  size_t row;
  size_type __n;
  size_t sVar8;
  size_t *psVar9;
  long lVar10;
  longdouble lVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar17;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sorted_ix;
  vector<double,_std::allocator<double>_> obs_weight;
  tuple<> local_c1;
  undefined1 local_c0 [16];
  double *local_b0;
  size_t local_a8;
  double local_a0;
  long local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  longdouble local_78;
  vector<double,_std::allocator<double>_> local_68;
  double local_48;
  double local_40;
  double local_38;
  
  bVar3 = first_run;
  if (first_run) {
    *coef = *coef / x_sd;
  }
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b0 = coef;
  local_a8 = end;
  local_a0 = x_mean;
  if (first_run && missing_action != Fail) {
    local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (unsigned_long *)0x0;
    std::vector<double,_std::allocator<double>_>::resize
              (&local_68,(end - st) + 1,(value_type_conflict *)&local_90);
  }
  sVar8 = local_a8;
  if (missing_action == Fail) {
    if (st <= local_a8) {
      local_c0._0_8_ = *local_b0;
      do {
        dVar12 = fma((double)x[ix_arr[st]] - local_a0,(double)local_c0._0_8_,*res);
        *res = dVar12;
        st = st + 1;
        res = res + 1;
      } while (st <= sVar8);
    }
  }
  else if (bVar3) {
    local_c0._0_10_ = (unkbyte10)0;
    if (local_a8 < st) {
      __n = 0;
      lVar10 = 0;
    }
    else {
      local_c0._8_2_ = (undefined2)((unkuint10)local_c0._0_10_ >> 0x40);
      local_c0._0_8_ = x;
      psVar9 = ix_arr + st;
      lVar11 = (longdouble)0;
      __n = 0;
      local_98 = 0;
      pdVar7 = res;
      sVar8 = st;
      do {
        if ((*(uint *)(local_c0._0_8_ + *psVar9 * 4) & 0x7fffffff) < 0x7f800000) {
          local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = psVar9;
          local_78 = lVar11;
          pVar17 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,psVar9,(piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_90,&local_c1);
          local_40 = *(double *)((pVar17.first.m_bucket.m_bucket)->m_value + 8);
          local_48 = (double)*(float *)(local_c0._0_8_ + *psVar9 * 4);
          dVar12 = fma(local_48 - local_a0,*local_b0,*pdVar7);
          *pdVar7 = dVar12;
          local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[__n] = local_40;
          buffer_arr[__n] = local_48;
          __n = __n + 1;
          local_38 = local_40;
          lVar11 = local_78 + (longdouble)local_40;
        }
        else {
          buffer_NAs[local_98] = sVar8;
          local_98 = local_98 + 1;
        }
        sVar8 = sVar8 + 1;
        pdVar7 = pdVar7 + 1;
        psVar9 = psVar9 + 1;
      } while (sVar8 <= local_a8);
      local_c0._0_10_ = lVar11 * (longdouble)0.5;
      lVar10 = local_98;
    }
    psVar9 = buffer_NAs;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_90,__n,(allocator_type *)&local_c1);
    __first = local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    auVar2 = _DAT_0036b1f0;
    if (local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar4 = ((long)local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start) - 8;
      auVar16._8_4_ = (int)uVar4;
      auVar16._0_8_ = uVar4;
      auVar16._12_4_ = (int)(uVar4 >> 0x20);
      auVar13._0_8_ = uVar4 >> 3;
      auVar13._8_8_ = auVar16._8_8_ >> 3;
      uVar6 = 0;
      auVar13 = auVar13 ^ _DAT_0036b1f0;
      auVar14 = _DAT_0036b1e0;
      do {
        auVar16 = auVar14 ^ auVar2;
        if ((bool)(~(auVar16._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar16._0_4_ ||
                    auVar13._4_4_ < auVar16._4_4_) & 1)) {
          local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] = uVar6;
        }
        if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
            auVar16._12_4_ <= auVar13._12_4_) {
          local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6 + 1] = uVar6 + 1;
        }
        uVar6 = uVar6 + 2;
        lVar5 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 2;
        auVar14._8_8_ = lVar5 + 2;
      } while (((uVar4 >> 3) + 2 & 0xfffffffffffffffe) != uVar6);
      if (local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar4 = (long)local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3;
        lVar5 = 0x3f;
        if (uVar4 != 0) {
          for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        local_78 = (longdouble)
                   CONCAT28(local_78._8_2_,
                            local_90.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<add_linear_comb_weighted<float,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>(unsigned_long_const*,unsigned_long,unsigned_long,double*,float_const*,double&,double,double,double&,MissingAction,double*,unsigned_long*,bool,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                   (ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_mult_hpp:627:19)>
                    )&buffer_arr);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<add_linear_comb_weighted<float,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>(unsigned_long_const*,unsigned_long,unsigned_long,double*,float_const*,double&,double,double,double&,MissingAction,double*,unsigned_long*,bool,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )__first,local_78._0_8_,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_mult_hpp:627:19)>
                    )&buffer_arr);
      }
    }
    *fill_val = buffer_arr
                [local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1]];
    if (__n != 0) {
      lVar11 = (longdouble)0;
      uVar4 = 0;
      do {
        lVar11 = lVar11 + (longdouble)
                          local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start
                          [local_90.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar4]];
        if ((longdouble)local_c0._0_10_ <= lVar11) {
          dVar12 = buffer_arr
                   [local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar4]];
          if (((lVar11 == (longdouble)local_c0._0_10_) &&
              (!NAN(lVar11) && !NAN((longdouble)local_c0._0_10_))) && (uVar4 < __n - 1)) {
            dVar12 = dVar12 + (buffer_arr
                               [local_90.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar4 + 1]] - dVar12) * 0.5
            ;
          }
          *fill_val = dVar12;
          break;
        }
        uVar4 = uVar4 + 1;
      } while (__n != uVar4);
    }
    dVar12 = (*fill_val - local_a0) * *local_b0;
    *fill_val = dVar12;
    if ((lVar10 != 0) && ((dVar12 != 0.0 || (NAN(dVar12))))) {
      lVar5 = 0;
      do {
        res[psVar9[lVar5] - st] = res[psVar9[lVar5] - st] + dVar12;
        lVar5 = lVar5 + 1;
      } while (lVar10 != lVar5);
    }
    if (local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
      operator_delete(local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else if (st <= local_a8) {
    dVar12 = *local_b0;
    dVar1 = *fill_val;
    do {
      dVar15 = dVar1;
      if ((uint)ABS(x[ix_arr[st]]) < 0x7f800000) {
        dVar15 = ((double)x[ix_arr[st]] - local_a0) * dVar12;
      }
      *res = dVar15 + *res;
      st = st + 1;
      res = res + 1;
    } while (st <= local_a8);
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void add_linear_comb_weighted(const size_t ix_arr[], size_t st, size_t end, double *restrict res,
                              const real_t_ *restrict x, double &coef, double x_sd, double x_mean, double &restrict fill_val,
                              MissingAction missing_action, double *restrict buffer_arr,
                              size_t *restrict buffer_NAs, bool first_run, mapping &restrict w)
{
    /* TODO: here don't need the buffer for NAs */

    if (first_run)
        coef /= x_sd;

    size_t cnt = 0;
    size_t cnt_NA = 0;
    double *restrict res_write = res - st;
    ldouble_safe cumw = 0;
    double w_this;
    /* TODO: these buffers should be allocated externally */
    std::vector<double> obs_weight;

    if (first_run && missing_action != Fail)
    {
        obs_weight.resize(end - st + 1, 0.);
    }

    if (missing_action == Fail)
    {    
        for (size_t row = st; row <= end; row++)
            res_write[row] = std::fma(x[ix_arr[row]] - x_mean, coef, res_write[row]);
    }

    else
    {
        if (first_run)
        {
            for (size_t row = st; row <= end; row++)
            {
                if (likely(!is_na_or_inf(x[ix_arr[row]])))
                {
                    w_this = w[ix_arr[row]];
                    res_write[row]     = std::fma(x[ix_arr[row]] - x_mean, coef, res_write[row]);
                    obs_weight[cnt]    = w_this;
                    buffer_arr[cnt++]  = x[ix_arr[row]];
                    cumw += w_this;
                }

                else
                {
                    buffer_NAs[cnt_NA++] = row;
                }

            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
            {
                res_write[row] += (is_na_or_inf(x[ix_arr[row]]))? fill_val : ( (x[ix_arr[row]]-x_mean) * coef );
            }
            return;
        }


        ldouble_safe mid_point = cumw / (ldouble_safe)2;
        std::vector<size_t> sorted_ix(cnt);
        std::iota(sorted_ix.begin(), sorted_ix.end(), (size_t)0);
        std::sort(sorted_ix.begin(), sorted_ix.end(),
                  [&buffer_arr](const size_t a, const size_t b){return buffer_arr[a] < buffer_arr[b];});
        ldouble_safe currw = 0;
        fill_val = buffer_arr[sorted_ix.back()]; /* <- will overwrite later */
        /* TODO: is this median calculation correct? should it do a weighted interpolation? */
        for (size_t ix = 0; ix < cnt; ix++)
        {
            currw += obs_weight[sorted_ix[ix]];
            if (currw >= mid_point)
            {
                if (currw == mid_point && ix < cnt-1)
                    fill_val = buffer_arr[sorted_ix[ix]] + (buffer_arr[sorted_ix[ix+1]] - buffer_arr[sorted_ix[ix]]) / 2.0;
                else
                    fill_val = buffer_arr[sorted_ix[ix]];
                break;
            }
        }

        fill_val = (fill_val - x_mean) * coef;
        if (cnt_NA && fill_val)
        {
            for (size_t row = 0; row < cnt_NA; row++)
                res_write[buffer_NAs[row]] += fill_val;
        }

    }
}